

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O3

Sfm_Ntk_t * Abc_NtkExtractMfs(Abc_Ntk_t *pNtk,int nFirstFixed)

{
  Vec_Int_t *pVVar1;
  uint uVar2;
  long *plVar3;
  uint uVar4;
  Vec_Ptr_t *__ptr;
  Vec_Wec_t *vFanins;
  Vec_Int_t *pVVar5;
  Vec_Str_t *vFixed;
  char *__s;
  Vec_Wrd_t *vTruths;
  word *__s_00;
  word wVar6;
  long lVar7;
  int *piVar8;
  Sfm_Ntk_t *pSVar9;
  Vec_Ptr_t *pVVar10;
  size_t __n;
  ulong uVar11;
  long lVar12;
  int iVar13;
  
  if (nFirstFixed == 0) {
    __ptr = Abc_NtkAssignIDs(pNtk);
  }
  else {
    __ptr = Abc_NtkAssignIDs2(pNtk);
  }
  pVVar10 = pNtk->vCos;
  __n = (long)pVVar10->nSize + (long)__ptr->nSize + (long)pNtk->vCis->nSize;
  vFanins = (Vec_Wec_t *)malloc(0x10);
  uVar2 = (uint)__n;
  uVar4 = 8;
  if (6 < uVar2 - 1) {
    uVar4 = uVar2;
  }
  vFanins->nCap = uVar4;
  if (uVar4 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)(int)uVar4,0x10);
  }
  vFanins->pArray = pVVar5;
  vFanins->nSize = uVar2;
  vFixed = (Vec_Str_t *)malloc(0x10);
  uVar4 = 0x10;
  if (0xe < uVar2 - 1) {
    uVar4 = uVar2;
  }
  vFixed->nCap = uVar4;
  if (uVar4 == 0) {
    __s = (char *)0x0;
  }
  else {
    __s = (char *)malloc((long)(int)uVar4);
  }
  vFixed->pArray = __s;
  vFixed->nSize = uVar2;
  memset(__s,0,__n);
  vTruths = (Vec_Wrd_t *)malloc(0x10);
  vTruths->nCap = uVar4;
  if (uVar4 == 0) {
    __s_00 = (word *)0x0;
  }
  else {
    __s_00 = (word *)malloc((long)(int)uVar4 << 3);
  }
  vTruths->pArray = __s_00;
  vTruths->nSize = uVar2;
  memset(__s_00,0,__n * 8);
  if (0 < __ptr->nSize) {
    lVar12 = 0;
    do {
      plVar3 = (long *)__ptr->pArray[lVar12];
      wVar6 = Abc_SopToTruth((char *)plVar3[7],*(int *)((long)plVar3 + 0x1c));
      iVar13 = (int)plVar3[8];
      if (((long)iVar13 < 0) || ((int)uVar2 <= iVar13)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
      }
      __s_00[iVar13] = wVar6;
      if (1 < wVar6 + 1) {
        lVar7 = (long)(int)*(uint *)(plVar3 + 8);
        if ((lVar7 < 0) || (uVar2 <= *(uint *)(plVar3 + 8))) goto LAB_002d508c;
        pVVar1 = pVVar5 + lVar7;
        iVar13 = *(int *)((long)plVar3 + 0x1c);
        if (pVVar5[lVar7].nCap < iVar13) {
          if (pVVar1->pArray == (int *)0x0) {
            piVar8 = (int *)malloc((long)iVar13 << 2);
          }
          else {
            piVar8 = (int *)realloc(pVVar1->pArray,(long)iVar13 << 2);
          }
          pVVar1->pArray = piVar8;
          if (piVar8 == (int *)0x0) goto LAB_002d50ca;
          pVVar1->nCap = iVar13;
          iVar13 = *(int *)((long)plVar3 + 0x1c);
        }
        if (0 < iVar13) {
          lVar7 = 0;
          do {
            Vec_IntPush(pVVar1,*(int *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                                 (long)*(int *)(plVar3[4] + lVar7 * 4) * 8) + 0x40))
            ;
            lVar7 = lVar7 + 1;
          } while (lVar7 < *(int *)((long)plVar3 + 0x1c));
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < __ptr->nSize);
    pVVar10 = pNtk->vCos;
  }
  if (0 < pVVar10->nSize) {
    lVar12 = 0;
    do {
      plVar3 = (long *)pVVar10->pArray[lVar12];
      lVar7 = (long)(int)plVar3[8];
      if ((lVar7 < 0) || ((int)uVar2 <= (int)plVar3[8])) {
LAB_002d508c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar1 = pVVar5 + lVar7;
      iVar13 = *(int *)((long)plVar3 + 0x1c);
      if (pVVar5[lVar7].nCap < iVar13) {
        if (pVVar1->pArray == (int *)0x0) {
          piVar8 = (int *)malloc((long)iVar13 << 2);
        }
        else {
          piVar8 = (int *)realloc(pVVar1->pArray,(long)iVar13 << 2);
        }
        pVVar1->pArray = piVar8;
        if (piVar8 == (int *)0x0) {
LAB_002d50ca:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar1->nCap = iVar13;
        iVar13 = *(int *)((long)plVar3 + 0x1c);
      }
      if (0 < iVar13) {
        lVar7 = 0;
        do {
          Vec_IntPush(pVVar1,*(int *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                               (long)*(int *)(plVar3[4] + lVar7 * 4) * 8) + 0x40));
          lVar7 = lVar7 + 1;
        } while (lVar7 < *(int *)((long)plVar3 + 0x1c));
      }
      lVar12 = lVar12 + 1;
      pVVar10 = pNtk->vCos;
    } while (lVar12 < pVVar10->nSize);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  uVar2 = pNtk->vCis->nSize;
  uVar11 = (ulong)uVar2;
  uVar4 = uVar2;
  if (0 < nFirstFixed) {
    do {
      if (((int)uVar2 < 0) || (vFixed->nSize <= (int)uVar11)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
      }
      vFixed->pArray[uVar11] = '\x01';
      uVar11 = uVar11 + 1;
      uVar4 = pNtk->vCis->nSize;
    } while ((int)uVar11 < (int)(uVar4 + nFirstFixed));
  }
  if ((-1 < nFirstFixed) && (nFirstFixed < pNtk->nObjCounts[7])) {
    pSVar9 = Sfm_NtkConstruct(vFanins,uVar4,pNtk->vCos->nSize,vFixed,(Vec_Str_t *)0x0,vTruths);
    return pSVar9;
  }
  __assert_fail("nFirstFixed >= 0 && nFirstFixed < Abc_NtkNodeNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMfs.c"
                ,0x82,"Sfm_Ntk_t *Abc_NtkExtractMfs(Abc_Ntk_t *, int)");
}

Assistant:

Sfm_Ntk_t * Abc_NtkExtractMfs( Abc_Ntk_t * pNtk, int nFirstFixed )
{
    Vec_Ptr_t * vNodes;
    Vec_Wec_t * vFanins;
    Vec_Str_t * vFixed;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vArray;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nObjs;
    vNodes  = nFirstFixed ? Abc_NtkAssignIDs2(pNtk) : Abc_NtkAssignIDs(pNtk);
    nObjs   = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes) + Abc_NtkCoNum(pNtk);
    vFanins = Vec_WecStart( nObjs );
    vFixed  = Vec_StrStart( nObjs );
    vTruths = Vec_WrdStart( nObjs );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        word uTruth = Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj));
        Vec_WrdWriteEntry( vTruths, pObj->iTemp, uTruth );
        if ( uTruth == 0 || ~uTruth == 0 )
            continue;
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Vec_PtrFree( vNodes );
    for ( i = Abc_NtkCiNum(pNtk); i < Abc_NtkCiNum(pNtk) + nFirstFixed; i++ )
        Vec_StrWriteEntry( vFixed, i, (char)1 );
    // update fixed
    assert( nFirstFixed >= 0 && nFirstFixed < Abc_NtkNodeNum(pNtk) );
//    for ( i = Abc_NtkCiNum(pNtk); i + Abc_NtkCoNum(pNtk) < Abc_NtkObjNum(pNtk); i++ )
//        if ( rand() % 10 == 0 )
//            Vec_StrWriteEntry( vFixed, i, (char)1 );
    return Sfm_NtkConstruct( vFanins, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), vFixed, NULL, vTruths );
}